

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

Spline * createFlatOffsetSpline(SplineStack *ss,float f,float g,float h,float i,float j,float k)

{
  Spline *pSVar1;
  Spline *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  
  iVar3 = ss->len;
  ss->len = iVar3 + 1;
  pSVar1 = ss->stack + iVar3;
  fVar6 = (g - f) * 0.5;
  if (k <= fVar6) {
    k = fVar6;
  }
  fVar6 = (h - g) * 5.0;
  ss->stack[iVar3].typ = 2;
  iVar4 = ss->flen;
  pSVar2 = (Spline *)(ss->fstack + iVar4);
  pSVar2->len = 1;
  pSVar2->typ = (int)f;
  iVar5 = ss->stack[iVar3].len;
  pSVar1->loc[iVar5] = -1.0;
  pSVar1->val[iVar5] = pSVar2;
  pSVar1->der[iVar5] = k;
  pSVar2 = (Spline *)(ss->fstack + (long)iVar4 + 1);
  pSVar2->len = 1;
  pSVar2->typ = (int)g;
  if (fVar6 <= k) {
    k = fVar6;
  }
  pSVar1->loc[(long)iVar5 + 1] = -0.4;
  pSVar1->val[(long)iVar5 + 1] = pSVar2;
  pSVar1->der[(long)iVar5 + 1] = k;
  ((Spline *)(ss->fstack + (long)iVar4 + 2))->len = 1;
  ss->fstack[(long)iVar4 + 2].val = h;
  pSVar1->loc[(long)iVar5 + 2] = 0.0;
  pSVar1->val[(long)iVar5 + 2] = (Spline *)(ss->fstack + (long)iVar4 + 2);
  pSVar1->der[(long)iVar5 + 2] = fVar6;
  ((Spline *)(ss->fstack + (long)iVar4 + 3))->len = 1;
  ss->fstack[(long)iVar4 + 3].val = i;
  pSVar1->loc[(long)iVar5 + 3] = 0.4;
  pSVar1->val[(long)iVar5 + 3] = (Spline *)(ss->fstack + (long)iVar4 + 3);
  pSVar1->der[(long)iVar5 + 3] = (i - h) + (i - h);
  ss->flen = iVar4 + 5;
  pSVar2 = (Spline *)(ss->fstack + (long)iVar4 + 4);
  pSVar2->len = 1;
  pSVar2->typ = (int)j;
  pSVar1->loc[(long)iVar5 + 4] = 1.0;
  pSVar1->val[(long)iVar5 + 4] = pSVar2;
  pSVar1->der[(long)iVar5 + 4] = (j - i) * 0.7;
  ss->stack[iVar3].len = iVar5 + 5;
  return pSVar1;
}

Assistant:

static Spline *createFlatOffsetSpline(
    SplineStack *ss, float f, float g, float h, float i, float j, float k)
{
    Spline *sp = &ss->stack[ss->len++];
    sp->typ = SP_RIDGES;

    float l = 0.5F * (g - f); if (l < k) l = k;
    float m = 5.0F * (h - g);

    addSplineVal(sp, -1.0F, createFixSpline(ss, f), l);
    addSplineVal(sp, -0.4F, createFixSpline(ss, g), l < m ? l : m);
    addSplineVal(sp,  0.0F, createFixSpline(ss, h), m);
    addSplineVal(sp,  0.4F, createFixSpline(ss, i), 2.0F*(i-h));
    addSplineVal(sp,  1.0F, createFixSpline(ss, j), 0.7F*(j-i));

    return sp;
}